

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void joystick_callback(int jid,int event)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  double dVar6;
  int local_1c;
  uint local_18;
  int hatCount;
  int buttonCount;
  int axisCount;
  int event_local;
  int jid_local;
  
  uVar1 = counter;
  buttonCount = event;
  axisCount = jid;
  if (event == 0x40001) {
    glfwGetJoystickAxes(jid,&hatCount);
    glfwGetJoystickButtons(axisCount,(int *)&local_18);
    glfwGetJoystickHats(axisCount,&local_1c);
    uVar1 = counter;
    counter = counter + 1;
    dVar6 = glfwGetTime();
    iVar2 = axisCount;
    pcVar4 = glfwGetJoystickName(axisCount);
    printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes, %i buttons, and %i hats\n",
           dVar6,(ulong)uVar1,(ulong)(uint)iVar2,pcVar4,(ulong)(uint)hatCount,(ulong)local_18,
           local_1c);
    iVar3 = glfwJoystickIsGamepad(axisCount);
    iVar2 = axisCount;
    if (iVar3 == 0) {
      pcVar4 = glfwGetJoystickGUID(axisCount);
      printf("  Joystick %i (%s) has no gamepad mapping\n",(ulong)(uint)iVar2,pcVar4);
    }
    else {
      pcVar4 = glfwGetJoystickGUID(axisCount);
      pcVar5 = glfwGetGamepadName(axisCount);
      printf("  Joystick %i (%s) has a gamepad mapping (%s)\n",(ulong)(uint)iVar2,pcVar4,pcVar5);
    }
  }
  else {
    counter = counter + 1;
    glfwGetTime();
    printf("%08x at %0.3f: Joystick %i was disconnected\n",(ulong)uVar1,(ulong)(uint)axisCount);
  }
  return;
}

Assistant:

static void joystick_callback(int jid, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axisCount, buttonCount, hatCount;

        glfwGetJoystickAxes(jid, &axisCount);
        glfwGetJoystickButtons(jid, &buttonCount);
        glfwGetJoystickHats(jid, &hatCount);

        printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes, %i buttons, and %i hats\n",
               counter++, glfwGetTime(),
               jid,
               glfwGetJoystickName(jid),
               axisCount,
               buttonCount,
               hatCount);

        if (glfwJoystickIsGamepad(jid))
        {
            printf("  Joystick %i (%s) has a gamepad mapping (%s)\n",
                   jid,
                   glfwGetJoystickGUID(jid),
                   glfwGetGamepadName(jid));
        }
        else
        {
            printf("  Joystick %i (%s) has no gamepad mapping\n",
                   jid,
                   glfwGetJoystickGUID(jid));
        }
    }
    else
    {
        printf("%08x at %0.3f: Joystick %i was disconnected\n",
               counter++, glfwGetTime(), jid);
    }
}